

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIOption.h
# Opt level: O3

void __thiscall libchess::UCIComboOption::set_option(UCIComboOption *this,value_type *value)

{
  const_iterator cVar1;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->allowed_values_)._M_h,value);
  if (cVar1.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    UCIOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    set_option(&this->
                super_UCIOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ,value);
    return;
  }
  return;
}

Assistant:

void set_option(const value_type& value) noexcept override {
        if (is_allowed(value)) {
            UCIOption<value_type>::set_option(value);
        }
    }